

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitwriter_buffer.c
# Opt level: O3

void aom_wb_write_uvlc(aom_write_bit_buffer *wb,uint32_t v)

{
  bool bVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  uVar3 = v + 1;
  uVar5 = 1;
  if (1 < uVar3) {
    uVar5 = 1;
    uVar2 = (ulong)uVar3;
    do {
      uVar5 = uVar5 + 1;
      bVar1 = 3 < uVar2;
      uVar2 = uVar2 >> 1;
      uVar4 = uVar5;
    } while (bVar1);
    do {
      aom_wb_write_bit(wb,0);
      uVar4 = uVar4 - 1;
    } while (1 < uVar4);
  }
  uVar5 = uVar5 + 1;
  do {
    aom_wb_write_bit(wb,(uint)((uVar3 >> (uVar5 - 2 & 0x1f) & 1) != 0));
    uVar5 = uVar5 - 1;
  } while (1 < uVar5);
  return;
}

Assistant:

void aom_wb_write_uvlc(struct aom_write_bit_buffer *wb, uint32_t v) {
  int64_t shift_val = ++v;
  int leading_zeroes = 1;

  assert(shift_val > 0);

  while (shift_val >>= 1) leading_zeroes += 2;

  aom_wb_write_literal(wb, 0, leading_zeroes >> 1);
  aom_wb_write_unsigned_literal(wb, v, (leading_zeroes + 1) >> 1);
}